

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prim-types.cc
# Opt level: O2

AssetInfo * __thiscall
tinyusdz::PrimMetas::get_assetInfo
          (AssetInfo *__return_storage_ptr__,PrimMetas *this,bool *is_authored)

{
  bool bVar1;
  Dictionary *__x;
  string identifier;
  MetaVariable identifier_var;
  MetaVariable name_var;
  allocator local_d1;
  Dictionary *local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8;
  storage_union local_a8;
  undefined **local_98;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_90;
  undefined8 local_88;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_80;
  storage_union local_70;
  undefined **local_60;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_58;
  undefined8 local_50;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_48;
  
  AssetInfo::AssetInfo(__return_storage_ptr__);
  if (is_authored != (bool *)0x0) {
    bVar1 = authored(this);
    *is_authored = bVar1;
  }
  bVar1 = authored(this);
  if (bVar1) {
    __x = &this->meta;
    local_d0 = &__return_storage_ptr__->_fields;
    std::
    _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>_>_>
    ::operator=((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>_>_>
                 *)local_d0,
                (_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>_>_>
                 *)__x);
    local_90 = &local_80;
    local_98 = &linb::any::vtable_for_type<decltype(nullptr)>()::table;
    local_a8.dynamic = (undefined ***)0x0;
    local_88 = 0;
    local_80._M_local_buf[0] = '\0';
    ::std::__cxx11::string::string((string *)&local_70,"identifier",(allocator *)&local_c8);
    bVar1 = GetCustomDataByKey(__x,(string *)&local_70,(MetaVariable *)&local_a8);
    ::std::__cxx11::string::_M_dispose();
    if (bVar1) {
      local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
      local_c8._M_string_length = 0;
      local_c8.field_2._M_allocated_capacity =
           local_c8.field_2._M_allocated_capacity & 0xffffffffffffff00;
      bVar1 = MetaVariable::get_value<std::__cxx11::string>((MetaVariable *)&local_a8,&local_c8);
      if (bVar1) {
        tinyusdz::value::AssetPath::AssetPath((AssetPath *)&local_70,&local_c8);
        tinyusdz::value::AssetPath::operator=
                  (&__return_storage_ptr__->identifier,(AssetPath *)&local_70);
        tinyusdz::value::AssetPath::~AssetPath((AssetPath *)&local_70);
        ::std::__cxx11::string::string((string *)&local_70,"identifier",&local_d1);
        ::std::
        _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>_>_>
        ::erase(&local_d0->_M_t,(key_type *)&local_70);
        ::std::__cxx11::string::_M_dispose();
      }
      ::std::__cxx11::string::_M_dispose();
    }
    MetaVariable::~MetaVariable((MetaVariable *)&local_a8);
    local_60 = &linb::any::vtable_for_type<decltype(nullptr)>()::table;
    local_70.dynamic = (void *)0x0;
    local_50 = 0;
    local_48._M_local_buf[0] = '\0';
    local_58 = &local_48;
    ::std::__cxx11::string::string((string *)&local_a8,"name",(allocator *)&local_c8);
    bVar1 = GetCustomDataByKey(__x,(string *)&local_a8,(MetaVariable *)&local_70);
    ::std::__cxx11::string::_M_dispose();
    if (bVar1) {
      local_a8.dynamic = &local_98;
      local_a8._8_8_ = 0;
      local_98 = (undefined **)((ulong)local_98 & 0xffffffffffffff00);
      bVar1 = MetaVariable::get_value<std::__cxx11::string>
                        ((MetaVariable *)&local_70,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &local_a8);
      if (bVar1) {
        ::std::__cxx11::string::_M_assign((string *)&__return_storage_ptr__->name);
        ::std::__cxx11::string::string((string *)&local_c8,"name",&local_d1);
        ::std::
        _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>_>_>
        ::erase(&local_d0->_M_t,&local_c8);
        ::std::__cxx11::string::_M_dispose();
      }
      ::std::__cxx11::string::_M_dispose();
    }
    MetaVariable::~MetaVariable((MetaVariable *)&local_70);
    local_60 = &linb::any::vtable_for_type<decltype(nullptr)>()::table;
    local_70.dynamic = (void *)0x0;
    local_50 = 0;
    local_48._M_local_buf[0] = '\0';
    local_58 = &local_48;
    ::std::__cxx11::string::string
              ((string *)&local_a8,"payloadAssetDependencies",(allocator *)&local_c8);
    bVar1 = GetCustomDataByKey(__x,(string *)&local_a8,(MetaVariable *)&local_70);
    ::std::__cxx11::string::_M_dispose();
    if (bVar1) {
      local_c8._M_dataplus._M_p = (pointer)0x0;
      local_c8._M_string_length = 0;
      local_c8.field_2._M_allocated_capacity = 0;
      bVar1 = MetaVariable::
              get_value<std::vector<tinyusdz::value::AssetPath,std::allocator<tinyusdz::value::AssetPath>>>
                        ((MetaVariable *)&local_70,
                         (vector<tinyusdz::value::AssetPath,_std::allocator<tinyusdz::value::AssetPath>_>
                          *)&local_c8);
      if (bVar1) {
        ::std::vector<tinyusdz::value::AssetPath,_std::allocator<tinyusdz::value::AssetPath>_>::
        operator=(&__return_storage_ptr__->payloadAssetDependencies,
                  (vector<tinyusdz::value::AssetPath,_std::allocator<tinyusdz::value::AssetPath>_> *
                  )&local_c8);
        ::std::__cxx11::string::string((string *)&local_a8,"payloadAssetDependencies",&local_d1);
        ::std::
        _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>_>_>
        ::erase(&local_d0->_M_t,(key_type *)&local_a8);
        ::std::__cxx11::string::_M_dispose();
      }
      ::std::vector<tinyusdz::value::AssetPath,_std::allocator<tinyusdz::value::AssetPath>_>::
      ~vector((vector<tinyusdz::value::AssetPath,_std::allocator<tinyusdz::value::AssetPath>_> *)
              &local_c8);
    }
    MetaVariable::~MetaVariable((MetaVariable *)&local_70);
    local_60 = &linb::any::vtable_for_type<decltype(nullptr)>()::table;
    local_70.dynamic = (void *)0x0;
    local_50 = 0;
    local_48._M_local_buf[0] = '\0';
    local_58 = &local_48;
    ::std::__cxx11::string::string((string *)&local_a8,"version",(allocator *)&local_c8);
    bVar1 = GetCustomDataByKey(__x,(string *)&local_a8,(MetaVariable *)&local_70);
    ::std::__cxx11::string::_M_dispose();
    if (bVar1) {
      local_a8.dynamic = &local_98;
      local_a8._8_8_ = 0;
      local_98 = (undefined **)((ulong)local_98 & 0xffffffffffffff00);
      bVar1 = MetaVariable::get_value<std::__cxx11::string>
                        ((MetaVariable *)&local_70,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &local_a8);
      if (bVar1) {
        ::std::__cxx11::string::_M_assign((string *)&__return_storage_ptr__->version);
        ::std::__cxx11::string::string((string *)&local_c8,"version",&local_d1);
        ::std::
        _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_tinyusdz::MetaVariable>_>_>
        ::erase(&local_d0->_M_t,&local_c8);
        ::std::__cxx11::string::_M_dispose();
      }
      ::std::__cxx11::string::_M_dispose();
    }
    MetaVariable::~MetaVariable((MetaVariable *)&local_70);
  }
  return __return_storage_ptr__;
}

Assistant:

AssetInfo PrimMeta::get_assetInfo(bool *is_authored) const {
  AssetInfo ainfo;

  if (is_authored) {
    (*is_authored) = authored();
  }

  if (authored()) {
    ainfo._fields = meta;

    {
      MetaVariable identifier_var;
      if (GetCustomDataByKey(meta, "identifier", &identifier_var)) {
        std::string identifier;
        if (identifier_var.get_value<std::string>(&identifier)) {
          ainfo.identifier = identifier;
          ainfo._fields.erase("identifier");
        }
      }
    }

    {
      MetaVariable name_var;
      if (GetCustomDataByKey(meta, "name", &name_var)) {
        std::string name;
        if (name_var.get_value<std::string>(&name)) {
          ainfo.name = name;
          ainfo._fields.erase("name");
        }
      }
    }

    {
      MetaVariable payloadDeps_var;
      if (GetCustomDataByKey(meta, "payloadAssetDependencies",
                             &payloadDeps_var)) {
        std::vector<value::AssetPath> assets;
        if (payloadDeps_var.get_value<std::vector<value::AssetPath>>(&assets)) {
          ainfo.payloadAssetDependencies = assets;
          ainfo._fields.erase("payloadAssetDependencies");
        }
      }
    }

    {
      MetaVariable version_var;
      if (GetCustomDataByKey(meta, "version", &version_var)) {
        std::string version;
        if (version_var.get_value<std::string>(&version)) {
          ainfo.version = version;
          ainfo._fields.erase("version");
        }
      }
    }
  }

  return ainfo;
}